

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void sat_solver2_setnvars(sat_solver2 *s,int n)

{
  int iVar1;
  int local_7c;
  int *local_78;
  uint *local_70;
  uint *local_68;
  cla *local_60;
  cla *local_58;
  int *local_50;
  lit *local_48;
  char *local_40;
  int *local_38;
  varinfo2 *local_30;
  veci *local_28;
  int local_18;
  int old_cap;
  int var;
  int n_local;
  sat_solver2 *s_local;
  
  if (s->cap < n) {
    iVar1 = s->cap;
    while (s->cap < n) {
      s->cap = s->cap * 2 + 1;
    }
    if (s->wlists == (veci *)0x0) {
      local_28 = (veci *)malloc((long)(s->cap << 1) << 4);
    }
    else {
      local_28 = (veci *)realloc(s->wlists,(long)(s->cap << 1) << 4);
    }
    s->wlists = local_28;
    if (s->vi == (varinfo2 *)0x0) {
      local_30 = (varinfo2 *)malloc((long)s->cap << 2);
    }
    else {
      local_30 = (varinfo2 *)realloc(s->vi,(long)s->cap << 2);
    }
    s->vi = local_30;
    if (s->levels == (int *)0x0) {
      local_38 = (int *)malloc((long)s->cap << 2);
    }
    else {
      local_38 = (int *)realloc(s->levels,(long)s->cap << 2);
    }
    s->levels = local_38;
    if (s->assigns == (char *)0x0) {
      local_40 = (char *)malloc((long)s->cap);
    }
    else {
      local_40 = (char *)realloc(s->assigns,(long)s->cap);
    }
    s->assigns = local_40;
    if (s->trail == (lit *)0x0) {
      local_48 = (lit *)malloc((long)s->cap << 2);
    }
    else {
      local_48 = (lit *)realloc(s->trail,(long)s->cap << 2);
    }
    s->trail = local_48;
    if (s->orderpos == (int *)0x0) {
      local_50 = (int *)malloc((long)s->cap << 2);
    }
    else {
      local_50 = (int *)realloc(s->orderpos,(long)s->cap << 2);
    }
    s->orderpos = local_50;
    if (s->reasons == (cla *)0x0) {
      local_58 = (cla *)malloc((long)s->cap << 2);
    }
    else {
      local_58 = (cla *)realloc(s->reasons,(long)s->cap << 2);
    }
    s->reasons = local_58;
    if (s->fProofLogging != 0) {
      if (s->units == (cla *)0x0) {
        local_60 = (cla *)malloc((long)s->cap << 2);
      }
      else {
        local_60 = (cla *)realloc(s->units,(long)s->cap << 2);
      }
      s->units = local_60;
    }
    if (s->activity == (uint *)0x0) {
      local_68 = (uint *)malloc((long)s->cap << 2);
    }
    else {
      local_68 = (uint *)realloc(s->activity,(long)s->cap << 2);
    }
    s->activity = local_68;
    if (s->activity2 == (uint *)0x0) {
      local_70 = (uint *)malloc((long)s->cap << 2);
    }
    else {
      local_70 = (uint *)realloc(s->activity2,(long)s->cap << 2);
    }
    s->activity2 = local_70;
    if (s->model == (int *)0x0) {
      local_78 = (int *)malloc((long)s->cap << 2);
    }
    else {
      local_78 = (int *)realloc(s->model,(long)s->cap << 2);
    }
    s->model = local_78;
    memset(s->wlists + (iVar1 << 1),0,(long)((s->cap - iVar1) * 2) << 4);
  }
  local_18 = s->size;
  while( true ) {
    if (n <= local_18) {
      local_7c = n;
      if (n <= s->size) {
        local_7c = s->size;
      }
      s->size = local_7c;
      return;
    }
    if (s->wlists[local_18 << 1].size != 0) break;
    if (s->wlists[local_18 * 2 + 1].size != 0) {
      __assert_fail("!s->wlists[2*var+1].size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x4af,"void sat_solver2_setnvars(sat_solver2 *, int)");
    }
    if (s->wlists[local_18 << 1].ptr == (int *)0x0) {
      veci_new(s->wlists + (local_18 << 1));
    }
    if (s->wlists[local_18 * 2 + 1].ptr == (int *)0x0) {
      veci_new(s->wlists + (local_18 * 2 + 1));
    }
    s->vi[local_18] = (varinfo2)0x0;
    s->levels[local_18] = 0;
    s->assigns[local_18] = '\x03';
    s->reasons[local_18] = 0;
    if (s->fProofLogging != 0) {
      s->units[local_18] = 0;
    }
    s->activity[local_18] = 0x400;
    s->model[local_18] = 0;
    iVar1 = veci_size(&s->order);
    s->orderpos[local_18] = iVar1;
    veci_push(&s->order,local_18);
    order_update(s,local_18);
    local_18 = local_18 + 1;
  }
  __assert_fail("!s->wlists[2*var].size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                ,0x4ae,"void sat_solver2_setnvars(sat_solver2 *, int)");
}

Assistant:

void sat_solver2_setnvars(sat_solver2* s,int n)
{
    int var;

    if (s->cap < n){
        int old_cap = s->cap;
        while (s->cap < n) s->cap = s->cap*2+1;

        s->wlists    = ABC_REALLOC(veci,     s->wlists,   s->cap*2);
        s->vi        = ABC_REALLOC(varinfo2, s->vi,       s->cap);
        s->levels    = ABC_REALLOC(int,      s->levels,   s->cap);
        s->assigns   = ABC_REALLOC(char,     s->assigns,  s->cap);
        s->trail     = ABC_REALLOC(lit,      s->trail,    s->cap);
        s->orderpos  = ABC_REALLOC(int,      s->orderpos, s->cap);
        s->reasons   = ABC_REALLOC(cla,      s->reasons,  s->cap);
        if ( s->fProofLogging )
        s->units     = ABC_REALLOC(cla,      s->units,    s->cap);
#ifdef USE_FLOAT_ACTIVITY2
        s->activity  = ABC_REALLOC(double,   s->activity, s->cap);
#else
        s->activity  = ABC_REALLOC(unsigned, s->activity, s->cap);
        s->activity2 = ABC_REALLOC(unsigned, s->activity2,s->cap);
#endif
        s->model     = ABC_REALLOC(int,      s->model,    s->cap);
        memset( s->wlists + 2*old_cap, 0, 2*(s->cap-old_cap)*sizeof(vecp) );
    }

    for (var = s->size; var < n; var++){
        assert(!s->wlists[2*var].size);
        assert(!s->wlists[2*var+1].size);
        if ( s->wlists[2*var].ptr == NULL )
            veci_new(&s->wlists[2*var]);
        if ( s->wlists[2*var+1].ptr == NULL )
            veci_new(&s->wlists[2*var+1]);
        *((int*)s->vi + var) = 0; //s->vi[var].val = varX;
        s->levels  [var] = 0;
        s->assigns [var] = varX;
        s->reasons [var] = 0;
        if ( s->fProofLogging )
        s->units   [var] = 0;
#ifdef USE_FLOAT_ACTIVITY2
        s->activity[var] = 0;
#else
        s->activity[var] = (1<<10);
#endif
        s->model   [var] = 0;
        // does not hold because variables enqueued at top level will not be reinserted in the heap
        // assert(veci_size(&s->order) == var); 
        s->orderpos[var] = veci_size(&s->order);
        veci_push(&s->order,var);
        order_update(s, var);
    }
    s->size = n > s->size ? n : s->size;
}